

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigPartReg.c
# Opt level: O0

Vec_Ptr_t * Aig_ManRegPartitionSimple(Aig_Man_t *pAig,int nPartSize,int nOverSize)

{
  int iVar1;
  Vec_Ptr_t *p;
  Vec_Int_t *p_00;
  int local_30;
  int local_2c;
  int Counter;
  int i;
  Vec_Int_t *vPart;
  Vec_Ptr_t *vResult;
  int nOverSize_local;
  int nPartSize_local;
  Aig_Man_t *pAig_local;
  
  vResult._0_4_ = nOverSize;
  if (nPartSize <= nOverSize) {
    printf("Overlap size (%d) is more or equal than the partition size (%d).\n",
           (ulong)(uint)nOverSize,(ulong)(uint)nPartSize);
    printf("Adjusting it to be equal to half of the partition size.\n");
    vResult._0_4_ = nPartSize / 2;
  }
  if ((int)vResult < nPartSize) {
    p = Vec_PtrAlloc(100);
    local_30 = 0;
    while( true ) {
      iVar1 = Aig_ManRegNum(pAig);
      if (iVar1 <= local_30) break;
      p_00 = Vec_IntAlloc(nPartSize);
      for (local_2c = 0; local_2c < nPartSize; local_2c = local_2c + 1) {
        iVar1 = Aig_ManRegNum(pAig);
        if (local_30 < iVar1) {
          Vec_IntPush(p_00,local_30);
        }
        local_30 = local_30 + 1;
      }
      iVar1 = Vec_IntSize(p_00);
      if ((int)vResult < iVar1) {
        Vec_PtrPush(p,p_00);
      }
      else {
        Vec_IntFree(p_00);
      }
      local_30 = local_30 - (int)vResult;
    }
    return p;
  }
  __assert_fail("nOverSize < nPartSize",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/aig/aigPartReg.c"
                ,0x1e5,"Vec_Ptr_t *Aig_ManRegPartitionSimple(Aig_Man_t *, int, int)");
}

Assistant:

Vec_Ptr_t * Aig_ManRegPartitionSimple( Aig_Man_t * pAig, int nPartSize, int nOverSize )
{
    Vec_Ptr_t * vResult;
    Vec_Int_t * vPart;
    int i, Counter;
    if ( nOverSize >= nPartSize )
    {
        printf( "Overlap size (%d) is more or equal than the partition size (%d).\n", nOverSize, nPartSize );
        printf( "Adjusting it to be equal to half of the partition size.\n" );
        nOverSize = nPartSize/2;
    }
    assert( nOverSize < nPartSize );
    vResult = Vec_PtrAlloc( 100 );
    for ( Counter = 0; Counter < Aig_ManRegNum(pAig); Counter -= nOverSize )
    {
        vPart = Vec_IntAlloc( nPartSize );
        for ( i = 0; i < nPartSize; i++, Counter++ )
            if ( Counter < Aig_ManRegNum(pAig) )
                Vec_IntPush( vPart, Counter );
        if ( Vec_IntSize(vPart) <= nOverSize )
            Vec_IntFree(vPart);
        else
            Vec_PtrPush( vResult, vPart );
    }
    return vResult;
}